

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

Bool SetWrap(TidyDocImpl *doc,uint indent)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (doc->pprint).linelen;
  uVar3 = (ulong)(uVar1 + indent);
  uVar2 = (doc->config).value[0x5d].v;
  if (uVar3 < uVar2) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar1;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  return (uint)(uVar3 < uVar2);
}

Assistant:

static Bool SetWrap( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrap = ( indent + pprint->linelen < cfg(doc, TidyWrapLen) );
    if ( wrap )
    {
        if ( pprint->indent[0].spaces < 0 )
            pprint->indent[0].spaces = indent;
        pprint->wraphere = pprint->linelen;
    }
    else if ( pprint->ixInd == 0 )
    {
        /* Save indent 1st time we pass the the wrap line */
        pprint->indent[ 1 ].spaces = indent;
        pprint->ixInd = 1;
    }
    return wrap;
}